

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void smooth_pred_8xh(__m128i *pixels,__m128i *wh,__m128i *ww,int h,uint8_t *dst,ptrdiff_t stride,
                    int second_half)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar17;
  uint uVar18;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar19;
  uint uVar20;
  uint uVar23;
  uint uVar24;
  undefined1 auVar21 [16];
  uint uVar25;
  undefined1 auVar22 [16];
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar5 = _DAT_0042e4a0;
  if (second_half != 0) {
    auVar5 = _DAT_00468750;
  }
  iVar3 = 0;
  if (0 < h) {
    iVar3 = h;
  }
  auVar6 = _DAT_00468760;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    auVar7 = pshufb((undefined1  [16])*wh,auVar6);
    auVar10 = pshufb((undefined1  [16])wh[1],auVar6);
    auVar9._0_12_ = auVar7._0_12_;
    auVar9._12_2_ = auVar7._6_2_;
    auVar9._14_2_ = auVar10._6_2_;
    auVar8._12_4_ = auVar9._12_4_;
    auVar8._0_10_ = auVar7._0_10_;
    auVar8._10_2_ = auVar10._4_2_;
    auVar21._10_6_ = auVar8._10_6_;
    auVar21._0_8_ = auVar7._0_8_;
    auVar21._8_2_ = auVar7._4_2_;
    auVar12._8_8_ = auVar21._8_8_;
    auVar12._6_2_ = auVar10._2_2_;
    auVar12._4_2_ = auVar7._2_2_;
    auVar12._0_2_ = auVar7._0_2_;
    auVar12._2_2_ = auVar10._0_2_;
    auVar10 = pmaddwd((undefined1  [16])*pixels,auVar12);
    auVar7 = pmaddwd(auVar12,(undefined1  [16])pixels[1]);
    auVar12 = pshufb((undefined1  [16])pixels[2],auVar5);
    auVar16._0_12_ = auVar12._0_12_;
    auVar16._12_2_ = auVar12._6_2_;
    auVar16._14_2_ = *(undefined2 *)((long)pixels[3] + 6);
    auVar15._12_4_ = auVar16._12_4_;
    auVar15._0_10_ = auVar12._0_10_;
    auVar15._10_2_ = *(undefined2 *)((long)pixels[3] + 4);
    auVar14._10_6_ = auVar15._10_6_;
    auVar14._0_8_ = auVar12._0_8_;
    auVar14._8_2_ = auVar12._4_2_;
    auVar13._8_8_ = auVar14._8_8_;
    auVar13._6_2_ = *(undefined2 *)((long)pixels[3] + 2);
    auVar13._4_2_ = auVar12._2_2_;
    auVar13._0_2_ = auVar12._0_2_;
    auVar13._2_2_ = (short)pixels[3][0];
    auVar21 = pmaddwd((undefined1  [16])*ww,auVar13);
    auVar12 = pmaddwd(auVar13,(undefined1  [16])ww[1]);
    uVar20 = auVar21._0_4_ + auVar10._0_4_ + 0x100;
    uVar23 = auVar21._4_4_ + auVar10._4_4_ + 0x100;
    uVar24 = auVar21._8_4_ + auVar10._8_4_ + 0x100;
    uVar25 = auVar21._12_4_ + auVar10._12_4_ + 0x100;
    uVar11 = auVar12._0_4_ + auVar7._0_4_ + 0x100;
    uVar17 = auVar12._4_4_ + auVar7._4_4_ + 0x100;
    uVar18 = auVar12._8_4_ + auVar7._8_4_ + 0x100;
    uVar19 = auVar12._12_4_ + auVar7._12_4_ + 0x100;
    sVar1 = (short)(uVar20 >> 9);
    uVar2 = (ushort)(uVar20 >> 0x19);
    auVar22[1] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar20 >> 0x19) - (0xff < uVar2);
    auVar22[0] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar20 >> 9) - (0xff < sVar1);
    sVar1 = (short)(uVar23 >> 9);
    auVar22[2] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar23 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar23 >> 0x19);
    auVar22[3] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar23 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar24 >> 9);
    auVar22[4] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar24 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar24 >> 0x19);
    auVar22[5] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar24 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar25 >> 9);
    auVar22[6] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar25 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar25 >> 0x19);
    auVar22[7] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar25 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar11 >> 9);
    auVar22[8] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar11 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar11 >> 0x19);
    auVar22[9] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar11 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar17 >> 9);
    auVar22[10] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar17 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar17 >> 0x19);
    auVar22[0xb] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar17 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar18 >> 9);
    auVar22[0xc] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar18 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar18 >> 0x19);
    auVar22[0xd] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar18 >> 0x19) - (0xff < uVar2);
    sVar1 = (short)(uVar19 >> 9);
    auVar22[0xe] = (0 < sVar1) * (sVar1 < 0x100) * (char)(uVar19 >> 9) - (0xff < sVar1);
    uVar2 = (ushort)(uVar19 >> 0x19);
    auVar22[0xf] = (uVar2 != 0) * (uVar2 < 0x100) * (byte)(uVar19 >> 0x19) - (0xff < uVar2);
    auVar7 = pshufb(auVar22,ZEXT816(0xe0c0a0806040200));
    *(long *)dst = auVar7._0_8_;
    dst = dst + stride;
    auVar7._0_2_ = auVar5._0_2_ + 1;
    auVar7._2_2_ = auVar5._2_2_ + 1;
    auVar7._4_2_ = auVar5._4_2_ + 1;
    auVar7._6_2_ = auVar5._6_2_ + 1;
    auVar7._8_2_ = auVar5._8_2_ + 1;
    auVar7._10_2_ = auVar5._10_2_ + 1;
    auVar7._12_2_ = auVar5._12_2_ + 1;
    auVar7._14_2_ = auVar5._14_2_ + 1;
    auVar10._0_2_ = auVar6._0_2_ + 0x202;
    auVar10._2_2_ = auVar6._2_2_ + 0x202;
    auVar10._4_2_ = auVar6._4_2_ + 0x202;
    auVar10._6_2_ = auVar6._6_2_ + 0x202;
    auVar10._8_2_ = auVar6._8_2_ + 0x202;
    auVar10._10_2_ = auVar6._10_2_ + 0x202;
    auVar10._12_2_ = auVar6._12_2_ + 0x202;
    auVar10._14_2_ = auVar6._14_2_ + 0x202;
    auVar5 = auVar7;
    auVar6 = auVar10;
  }
  return;
}

Assistant:

static inline void smooth_pred_8xh(const __m128i *pixels, const __m128i *wh,
                                   const __m128i *ww, int h, uint8_t *dst,
                                   ptrdiff_t stride, int second_half) {
  const __m128i round = _mm_set1_epi32((1 << SMOOTH_WEIGHT_LOG2_SCALE));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i inc = _mm_set1_epi16(0x202);
  const __m128i gat = _mm_set_epi32(0, 0, 0xe0c0a08, 0x6040200);

  __m128i rep = second_half ? _mm_set1_epi16((short)0x8008)
                            : _mm_set1_epi16((short)0x8000);
  __m128i d = _mm_set1_epi16(0x100);

  int i;
  for (i = 0; i < h; ++i) {
    const __m128i wg_wg = _mm_shuffle_epi8(wh[0], d);
    const __m128i sc_sc = _mm_shuffle_epi8(wh[1], d);
    const __m128i wh_sc = _mm_unpacklo_epi16(wg_wg, sc_sc);
    __m128i s0 = _mm_madd_epi16(pixels[0], wh_sc);
    __m128i s1 = _mm_madd_epi16(pixels[1], wh_sc);

    __m128i b = _mm_shuffle_epi8(pixels[2], rep);
    b = _mm_unpacklo_epi16(b, pixels[3]);
    __m128i sum0 = _mm_madd_epi16(b, ww[0]);
    __m128i sum1 = _mm_madd_epi16(b, ww[1]);

    s0 = _mm_add_epi32(s0, sum0);
    s0 = _mm_add_epi32(s0, round);
    s0 = _mm_srai_epi32(s0, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    s1 = _mm_add_epi32(s1, sum1);
    s1 = _mm_add_epi32(s1, round);
    s1 = _mm_srai_epi32(s1, 1 + SMOOTH_WEIGHT_LOG2_SCALE);

    sum0 = _mm_packus_epi16(s0, s1);
    sum0 = _mm_shuffle_epi8(sum0, gat);
    _mm_storel_epi64((__m128i *)dst, sum0);
    dst += stride;

    rep = _mm_add_epi16(rep, one);
    d = _mm_add_epi16(d, inc);
  }
}